

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.hpp
# Opt level: O0

void czh::utils::fill_exponent(int K,string *buffer)

{
  string *buffer_local;
  int K_local;
  
  buffer_local._4_4_ = K;
  if (K < 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (buffer,'-');
    buffer_local._4_4_ = -K;
  }
  if (buffer_local._4_4_ < 100) {
    if (buffer_local._4_4_ < 10) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (buffer,(char)buffer_local._4_4_ + '0');
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (buffer,(char)(buffer_local._4_4_ / 10) + '0');
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (buffer,(char)(buffer_local._4_4_ % 10) + '0');
    }
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (buffer,(char)(buffer_local._4_4_ / 100) + '0');
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (buffer,(char)((buffer_local._4_4_ % 100) / 10) + '0');
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (buffer,(char)((buffer_local._4_4_ % 100) % 10) + '0');
  }
  return;
}

Assistant:

void fill_exponent(int K, std::string &buffer)
  {
    if (K < 0)
    {
      buffer += '-';
      K = -K;
    }
  
    if (K >= 100)
    {
      buffer += static_cast<char>(static_cast<int>('0') + K / 100);
      K %= 100;
      buffer += static_cast<char>(static_cast<int>('0') + K / 10);
      K %= 10;
      buffer += static_cast<char>(static_cast<int>('0') + K);
    }
    else if (K >= 10)
    {
      buffer += static_cast<char>(static_cast<int>('0') + K / 10);
      K %= 10;
      buffer += static_cast<char>(static_cast<int>('0') + K);
    }
    else
      buffer += static_cast<char>(static_cast<int>('0') + K);
  }